

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlChar * xmlSchemaFormatQName(xmlChar **buf,xmlChar *namespaceName,xmlChar *localName)

{
  xmlChar *pxVar1;
  char *add;
  
  if (*buf != (xmlChar *)0x0) {
    (*xmlFree)(*buf);
    *buf = (xmlChar *)0x0;
  }
  if (namespaceName == (xmlChar *)0x0) {
    if (localName != (xmlChar *)0x0) {
      return localName;
    }
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    pxVar1 = xmlStrdup((xmlChar *)"{");
    *buf = pxVar1;
    pxVar1 = xmlStrcat(pxVar1,namespaceName);
    *buf = pxVar1;
    pxVar1 = xmlStrcat(pxVar1,"}");
    *buf = pxVar1;
    add = (char *)localName;
    if (localName != (xmlChar *)0x0) goto LAB_00184906;
  }
  add = "(NULL)";
LAB_00184906:
  pxVar1 = xmlStrcat(pxVar1,(xmlChar *)add);
  *buf = pxVar1;
  return pxVar1;
}

Assistant:

static const xmlChar*
xmlSchemaFormatQName(xmlChar **buf,
		     const xmlChar *namespaceName,
		     const xmlChar *localName)
{
    FREE_AND_NULL(*buf)
    if (namespaceName != NULL) {
	*buf = xmlStrdup(BAD_CAST "{");
	*buf = xmlStrcat(*buf, namespaceName);
	*buf = xmlStrcat(*buf, BAD_CAST "}");
    }
    if (localName != NULL) {
	if (namespaceName == NULL)
	    return(localName);
	*buf = xmlStrcat(*buf, localName);
    } else {
	*buf = xmlStrcat(*buf, BAD_CAST "(NULL)");
    }
    return ((const xmlChar *) *buf);
}